

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *batchResultFilename;
  char *dstFileName;
  exception *e;
  exception *anon_var_0;
  undefined1 local_58 [8];
  CommandLine cmdLine;
  char **argv_local;
  int argc_local;
  
  cmdLine.outputFile.field_2._8_8_ = argv;
  CommandLine::CommandLine((CommandLine *)local_58);
  parseCommandLine((CommandLine *)local_58,argc,(char **)cmdLine.outputFile.field_2._8_8_);
  batchResultFilename = (char *)std::__cxx11::string::c_str();
  dstFileName = (char *)std::__cxx11::string::c_str();
  batchResultToJUnitReport(batchResultFilename,dstFileName);
  CommandLine::~CommandLine((CommandLine *)local_58);
  return 0;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;
	try
	{
		parseCommandLine(cmdLine, argc, argv);
	}
	catch (const std::exception&)
	{
		printHelp(argv[0]);
		return -1;
	}

	try
	{
		batchResultToJUnitReport(cmdLine.batchResultFile.c_str(), cmdLine.outputFile.c_str());
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}